

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Minisat::StringOption::hasDefaultValue(StringOption *this)

{
  char *pcVar1;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_1 = *(long *)(in_RDI + 0x38) == 0;
  }
  else if (*(long *)(in_RDI + 0x38) == 0) {
    local_1 = *(long *)(in_RDI + 0x30) == 0;
  }
  else {
    pcVar1 = *(char **)(in_RDI + 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    local_1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool hasDefaultValue()
    {
        if (value == NULL) {
            return defaultValue == NULL;
        } else if (defaultValue == NULL) {
            return value == NULL;
        } else {
            return *value == std::string(defaultValue);
        }
    }